

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O3

void __thiscall
draco::ObjEncoder::FindOriginalFaceEdges
          (ObjEncoder *this,FaceIndex face_index,CornerTable *corner_table,
          vector<bool,_std::allocator<bool>_> *triangle_visited,PolygonEdges *polygon_edges)

{
  CornerIndex ci;
  _Bit_type *p_Var1;
  ulong uVar2;
  pointer paVar3;
  ulong uVar4;
  bool bVar5;
  CornerIndex ci_00;
  CornerTable *ct;
  int iVar6;
  long lVar7;
  long lVar8;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_40;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_3c;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  uVar4 = (ulong)face_index.value_;
  p_Var1 = (triangle_visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  ct = (CornerTable *)(ulong)(face_index.value_ >> 6);
  uVar2 = p_Var1[(long)ct];
  if ((uVar2 >> (uVar4 & 0x3f) & 1) == 0) {
    p_Var1[(long)ct] = uVar2 | 1L << ((byte)face_index.value_ & 0x3f);
    paVar3 = (this->in_mesh_->faces_).vector_.
             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = face_index.value_ * 3;
    if (face_index.value_ == 0xffffffff) {
      iVar6 = -1;
    }
    lVar7 = 0;
    local_38 = triangle_visited;
    do {
      ci_00.value_ = (int)lVar7 + iVar6;
      if (ci_00.value_ == 0xffffffff) {
        IsNewEdge(this,ct,(CornerIndex)0xffffffff);
LAB_001161f2:
        lVar8 = 0;
        if (lVar7 != 2) {
          lVar8 = lVar7 + 1;
        }
        local_40.value_ = paVar3[uVar4]._M_elems[lVar8].value_;
        lVar8 = lVar7 + -1;
        if (lVar7 == 0) {
          lVar8 = 2;
        }
        local_3c.value_ = paVar3[uVar4]._M_elems[lVar8].value_;
        if (this->pos_att_->identity_mapping_ == false) {
          local_40.value_ =
               (this->pos_att_->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_40.value_].value_;
        }
        ct = (CornerTable *)&stack0xffffffffffffffc0;
        std::
        _Rb_tree<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>,std::_Select1st<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>,std::less<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>>
        ::
        _M_insert_unique<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>
                  ((_Rb_tree<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>,std::_Select1st<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>,std::less<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>>
                    *)polygon_edges,
                   (pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
                    *)ct);
      }
      else {
        ci.value_ = (corner_table->opposite_corners_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[ci_00.value_].value_;
        bVar5 = IsNewEdge(this,ct,ci_00);
        if (bVar5) {
          if (ci.value_ == 0xffffffff) goto LAB_001161f2;
        }
        else if ((ci.value_ == 0xffffffff) || (bVar5 = IsNewEdge(this,ct,ci), !bVar5))
        goto LAB_001161f2;
        ct = (CornerTable *)((ulong)ci.value_ / 3);
        FindOriginalFaceEdges(this,(FaceIndex)(ci.value_ / 3),corner_table,local_38,polygon_edges);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  return;
}

Assistant:

void ObjEncoder::FindOriginalFaceEdges(FaceIndex face_index,
                                       const CornerTable &corner_table,
                                       std::vector<bool> *triangle_visited,
                                       PolygonEdges *polygon_edges) {
  // Do not add any edges if this triangular face has already been visited.
  if ((*triangle_visited)[face_index.value()]) {
    return;
  }
  (*triangle_visited)[face_index.value()] = true;
  const Mesh::Face &face = in_mesh_->face(face_index);
  for (size_t c = 0; c < 3; c++) {
    // Check for added edge using this corner.
    const CornerIndex ci = corner_table.FirstCorner(face_index) + c;
    const CornerIndex co = corner_table.Opposite(ci);
    bool is_new_edge = IsNewEdge(corner_table, ci);

    // Check for the new edge using the opposite corner.
    if (!is_new_edge && co != kInvalidCornerIndex) {
      is_new_edge = IsNewEdge(corner_table, co);
    }
    // The new edge may become a boundary edge when a degenerate triangle
    // created by polygon triangulation is removed by Draco encoder, hence |co|
    // is checked below. This can happen when an isolated (boundary) quad only
    // has three distinct vertex positions.
    //
    // TODO(vytyaz): Fix polygon reconstruction with other possible cases of
    // degenerate triangles. There are two known sources of degenerate triangles
    // that affect polygon reconstruction:
    //
    // 1. Degenerate triangles created during polygon triangulation are removed
    //    by Draco encoder, which invalidates the "added_edges" attribute.
    //    Solution is to discard those triangles before creating the attribute.
    //
    // 2. Degenerate triangles created by position quantization are encoded and
    //    decoded by Draco, but not captured into the |corner_table|, causing a
    //    mismatch between the corner table and the "added_edges" attribute.
    //    Solution is to use corner table from draco::MeshDecoder here.
    //
    if (is_new_edge && co != kInvalidCornerIndex) {
      // Visit triangle across the new edge.
      const FaceIndex opposite_face_index = corner_table.Face(co);
      FindOriginalFaceEdges(opposite_face_index, corner_table, triangle_visited,
                            polygon_edges);
    } else {
      // Insert the original edge to the map.
      const PointIndex point_from = face[(c + 1) % 3];
      const PointIndex point_to = face[(c + 2) % 3];
      polygon_edges->insert(
          {PositionIndex(pos_att_->mapped_index(point_from)), point_to});
    }
  }
}